

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::~HeapBucketT(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
               *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  size_t sVar5;
  
  DeleteHeapBlockList(this,this->heapBlockList);
  DeleteHeapBlockList(this,this->fullBlockList);
  if ((this->super_HeapBucket).heapBlockCount + (this->super_HeapBucket).newHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x69,"(this->heapBlockCount + this->newHeapBlockCount == 0)",
                       "this->heapBlockCount + this->newHeapBlockCount == 0");
    if (!bVar3) goto LAB_0064592b;
    *puVar4 = 0;
  }
  uVar1 = (this->super_HeapBucket).emptyHeapBlockCount;
  sVar5 = HeapBlockList::
          Count<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->emptyBlockList);
  if (sVar5 != uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6b,
                       "(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList))",
                       "this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)");
    if (!bVar3) goto LAB_0064592b;
    *puVar4 = 0;
  }
  HeapBlockList::
  ForEachEditing<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::DeleteEmptyHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->emptyBlockList);
  if ((this->super_HeapBucket).newHeapBlockCount + (this->super_HeapBucket).heapBlockCount +
      (this->super_HeapBucket).emptyHeapBlockCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x6e,
                       "(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0)"
                       ,
                       "this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0"
                      );
    if (!bVar3) {
LAB_0064592b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

HeapBucketT<TBlockType>::~HeapBucketT()
{
    DeleteHeapBlockList(this->heapBlockList);
    DeleteHeapBlockList(this->fullBlockList);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (allocableHeapBlockListHead != nullptr)
    {
        if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
        {
            FlushInterlockedSList(this->allocableHeapBlockListHead);
        }

        _aligned_free(this->allocableHeapBlockListHead);
    }

    DeleteHeapBlockList(this->sweepableHeapBlockList);
#endif
#endif

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    Assert(this->heapBlockCount + this->newHeapBlockCount == 0);
#endif
    RECYCLER_SLOW_CHECK(Assert(this->emptyHeapBlockCount == HeapBlockList::Count(this->emptyBlockList)));
    DeleteEmptyHeapBlockList(this->emptyBlockList);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    Assert(this->heapBlockCount + this->newHeapBlockCount + this->emptyHeapBlockCount == 0);
#endif
}